

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

int AF_AWeapon_A_ZoomFactor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  VMValue *pVVar8;
  undefined4 in_register_00000014;
  TArray<VMValue,_VMValue> *pTVar9;
  char *pcVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_004b1597:
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_004b15c2;
    }
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pTVar9 = defaultparam;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar14 = (**(code **)*puVar2)(puVar2);
        uVar6 = auVar14._8_8_;
        puVar2[1] = auVar14._0_8_;
      }
      pPVar7 = (PClass *)puVar2[1];
      bVar11 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar11);
      pTVar9 = (TArray<VMValue,_VMValue> *)(ulong)(pPVar7 == pPVar5 || bVar11);
      if (pPVar7 != pPVar5 && !bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004b15c2;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_004b1597;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,pTVar9,uVar6,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar11) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar11 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b15c2;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pVVar8 = defaultparam->Array;
            if (defaultparam->Array[3].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004b15e1:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                            ,0x82a,
                            "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            pVVar8 = param;
            if (param[3].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
              goto LAB_004b15e1;
            }
          }
          dVar12 = pVVar8[3].field_0.f;
          if (numparam < 5) {
            param = defaultparam->Array;
            if (param[4].field_0.field_3.Type == '\0') goto LAB_004b14ff;
            pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[4].field_0.field_3.Type == '\0') {
LAB_004b14ff:
              lVar4 = puVar2[0x46];
              if ((lVar4 != 0) && (*(long *)(lVar4 + 0xd0) != 0)) {
                uVar1 = param[4].field_0.i;
                dVar13 = 50.0;
                if (dVar12 <= 50.0) {
                  dVar13 = dVar12;
                }
                dVar12 = (double)(-(ulong)(0.1 < dVar12) & (ulong)(1.0 / dVar13) |
                                 ~-(ulong)(0.1 < dVar12) & 0x4024000000000000);
                if ((uVar1 & 1) != 0) {
                  *(float *)(lVar4 + 0x5c) = (float)((double)*(float *)(lVar4 + 0x58) * dVar12);
                }
                if ((uVar1 & 2) != 0) {
                  dVar12 = -dVar12;
                }
                *(float *)(*(long *)(lVar4 + 0xd0) + 0x598) = (float)dVar12;
              }
              return 0;
            }
            pcVar10 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                        ,0x82b,
                        "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar10 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_004b15c2;
      }
    }
  }
  pcVar10 = "(paramnum) < numparam";
LAB_004b15c2:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                ,0x829,
                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, A_ZoomFactor)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(zoom);
	PARAM_INT_DEF(flags);

	if (self->player != NULL && self->player->ReadyWeapon != NULL)
	{
		zoom = 1 / clamp(zoom, 0.1, 50.0);
		if (flags & 1)
		{ // Make the zoom instant.
			self->player->FOV = float(self->player->DesiredFOV * zoom);
		}
		if (flags & 2)
		{ // Disable pitch/yaw scaling.
			zoom = -zoom;
		}
		self->player->ReadyWeapon->FOVScale = float(zoom);
	}
	return 0;
}